

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O3

ags_t AGSSock::SockAddr_get_Port(SockAddr *sa)

{
  ushort uVar1;
  
  if (((sa->super_sockaddr_storage).ss_family | 8) == 10) {
    uVar1 = *(ushort *)(sa->super_sockaddr_storage).__ss_padding;
    return (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
  }
  return 0;
}

Assistant:

ags_t SockAddr_get_Port(SockAddr *sa)
{
	if (sa->ss_family == AF_INET)
	{
		sockaddr_in *addr = reinterpret_cast<sockaddr_in *> (sa);
		return ntohs(addr->sin_port);
	}
	else if (sa->ss_family == AF_INET6)
	{
		sockaddr_in6 *addr = reinterpret_cast<sockaddr_in6 *> (sa);
		return ntohs(addr->sin6_port);
	}
	else
		return 0;
}